

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O1

void slang::ast::Expression::selfDetermined(ASTContext *context,Expression **expr)

{
  Expression *pEVar1;
  PropagationVisitor local_38;
  
  pEVar1 = *expr;
  local_38.newType = (pEVar1->type).ptr;
  local_38.parentExpr = (Expression *)0x0;
  local_38.opRange.startLoc = (SourceLocation)0x0;
  local_38.opRange.endLoc = (SourceLocation)0x0;
  local_38.conversionKind = Propagated;
  local_38.context = context;
  pEVar1 = visitExpression<slang::ast::Expression,slang::ast::Expression::PropagationVisitor&>
                     (pEVar1,pEVar1,&local_38);
  *expr = pEVar1;
  return;
}

Assistant:

void Expression::selfDetermined(const ASTContext& context, Expression*& expr) {
    SLANG_ASSERT(expr->type);
    PropagationVisitor visitor(context, *expr->type, nullptr, {}, ConversionKind::Propagated);
    expr = &expr->visit(visitor);
}